

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)

{
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  uint32_t curpixel;
  uint32_t num_pixels;
  uint32_t num_add;
  uint32_t num;
  uint32_t den;
  uint32_t yinc2;
  uint32_t yinc1;
  uint32_t xinc2;
  uint32_t xinc1;
  uint32_t y;
  uint32_t x;
  uint32_t deltay;
  uint32_t deltax;
  uint8_t color_local;
  uint16_t y2_local;
  uint16_t x2_local;
  uint16_t y1_local;
  uint16_t x1_local;
  
  if ((int)((uint)x2 - (uint)x1) < 1) {
    local_4c = -((uint)x2 - (uint)x1);
  }
  else {
    local_4c = (uint)x2 - (uint)x1;
  }
  if ((int)((uint)y2 - (uint)y1) < 1) {
    local_50 = -((uint)y2 - (uint)y1);
  }
  else {
    local_50 = (uint)y2 - (uint)y1;
  }
  xinc1 = (uint32_t)x1;
  xinc2 = (uint32_t)y1;
  if (x2 < x1) {
    yinc1 = 0xffffffff;
    yinc2 = 0xffffffff;
  }
  else {
    yinc1 = 1;
    yinc2 = 1;
  }
  if (y2 < y1) {
    den = 0xffffffff;
    num = 0xffffffff;
  }
  else {
    den = 1;
    num = 1;
  }
  if (local_4c < local_50) {
    yinc2 = 0;
    den = 0;
    curpixel = local_4c;
    local_4c = local_50;
  }
  else {
    yinc1 = 0;
    num = 0;
    curpixel = local_50;
  }
  num_pixels = local_4c >> 1;
  for (local_48 = 0; local_48 <= local_4c; local_48 = local_48 + 1) {
    EPD_DrawPixel((uint16_t)xinc1,(uint16_t)xinc2,color);
    num_pixels = curpixel + num_pixels;
    if (local_4c <= num_pixels) {
      num_pixels = num_pixels - local_4c;
      xinc1 = yinc1 + xinc1;
      xinc2 = den + xinc2;
    }
    xinc1 = yinc2 + xinc1;
    xinc2 = num + xinc2;
  }
  return;
}

Assistant:

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)
{
	  uint32_t deltax = 0, deltay = 0, x = 0, y = 0, xinc1 = 0, xinc2 = 0, 
	  yinc1 = 0, yinc2 = 0, den = 0, num = 0, num_add = 0, num_pixels = 0, 
	  curpixel = 0;
	  
	  deltax = ABS(x2 - x1);        /* The difference between the x's */
	  deltay = ABS(y2 - y1);        /* The difference between the y's */
	  x = x1;                       /* Start x off at the first pixel */
	  y = y1;                       /* Start y off at the first pixel */
	  
	  if (x2 >= x1)                 /* The x-values are increasing */
	  {
		    xinc1 = 1;
		    xinc2 = 1;
	  }
	  else                          /* The x-values are decreasing */
	  {
		    xinc1 = -1;
		    xinc2 = -1;
	  }
	  
	  if (y2 >= y1)                 /* The y-values are increasing */
	  {
		    yinc1 = 1;
		    yinc2 = 1;
	  }
	  else                          /* The y-values are decreasing */
	  {
		    yinc1 = -1;
		    yinc2 = -1;
	  }
	  
	  if (deltax >= deltay)         /* There is at least one x-value for every y-value */
	  {
		    xinc1 = 0;              /* Don't change the x when numerator >= denominator */
		    yinc2 = 0;              /* Don't change the y for every iteration */
		    den = deltax;
		    num = deltax / 2;
		    num_add = deltay;
		    num_pixels = deltax;    /* There are more x-values than y-values */
	  }
	  else                          /* There is at least one y-value for every x-value */
	  {
		    xinc2 = 0;              /* Don't change the x for every iteration */
		    yinc1 = 0;              /* Don't change the y when numerator >= denominator */
		    den = deltay;
		    num = deltay / 2;
		    num_add = deltax;
		    num_pixels = deltay;    /* There are more y-values than x-values */
	  }
	  
	  for (curpixel = 0; curpixel <= num_pixels; curpixel++)
	  {
		    EPD_DrawPixel(x, y, color);          /* Draw the current pixel */
		    num += num_add;                      /* Increase the numerator by the top of the fraction */
		    if (num >= den)                      /* Check if numerator >= denominator */
		    {
			      num -= den;                    /* Calculate the new numerator value */
			      x += xinc1;                    /* Change the x as appropriate */
			      y += yinc1;                    /* Change the y as appropriate */
		    }
		    x += xinc2;                          /* Change the x as appropriate */
		    y += yinc2;                          /* Change the y as appropriate */
	  }
}